

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmopl.c
# Opt level: O2

void ym3526_update_one(void *chip,UINT32 length,DEV_SMPL **buffer)

{
  byte bVar1;
  DEV_SMPL DVar2;
  DEV_SMPL *pDVar3;
  DEV_SMPL *pDVar4;
  ulong uVar5;
  
  if (length != 0) {
    bVar1 = *(byte *)((long)chip + 0x6e0);
    pDVar3 = *buffer;
    pDVar4 = buffer[1];
    for (uVar5 = 0; length != uVar5; uVar5 = uVar5 + 1) {
      *(undefined4 *)((long)chip + 0x17ac) = 0;
      advance_lfo((FM_OPL *)chip);
      OPL_CALC_CH((FM_OPL *)chip,(OPL_CH *)((long)chip + 8));
      OPL_CALC_CH((FM_OPL *)chip,(OPL_CH *)((long)chip + 200));
      OPL_CALC_CH((FM_OPL *)chip,(OPL_CH *)((long)chip + 0x188));
      OPL_CALC_CH((FM_OPL *)chip,(OPL_CH *)((long)chip + 0x248));
      OPL_CALC_CH((FM_OPL *)chip,(OPL_CH *)((long)chip + 0x308));
      OPL_CALC_CH((FM_OPL *)chip,(OPL_CH *)((long)chip + 0x3c8));
      if ((bVar1 & 0x20) == 0) {
        OPL_CALC_CH((FM_OPL *)chip,(OPL_CH *)((long)chip + 0x488));
        OPL_CALC_CH((FM_OPL *)chip,(OPL_CH *)((long)chip + 0x548));
        OPL_CALC_CH((FM_OPL *)chip,(OPL_CH *)((long)chip + 0x608));
      }
      else {
        OPL_CALC_RH((FM_OPL *)chip,(OPL_CH *)((long)chip + 8),*(uint *)((long)chip + 0x1700) & 1);
      }
      DVar2 = *(DEV_SMPL *)((long)chip + 0x17ac);
      pDVar3[uVar5] = DVar2;
      pDVar4[uVar5] = DVar2;
      advance((FM_OPL *)chip);
    }
    return;
  }
  refresh_eg((FM_OPL *)chip);
  return;
}

Assistant:

void ym3526_update_one(void *chip, UINT32 length, DEV_SMPL **buffer)
{
	FM_OPL      *OPL = (FM_OPL *)chip;
	UINT8       rhythm = OPL->rhythm&0x20;
	DEV_SMPL    *bufL;
	DEV_SMPL    *bufR;
	UINT32 i;

	if (! length)
	{
		refresh_eg(OPL);
		return;
	}
	
	bufL = buffer[0];
	bufR = buffer[1];
	for( i=0; i < length ; i++ )
	{
		int lt;

		OPL->output[0] = 0;

		advance_lfo(OPL);

		/* FM part */
		OPL_CALC_CH(OPL, &OPL->P_CH[0]);
		OPL_CALC_CH(OPL, &OPL->P_CH[1]);
		OPL_CALC_CH(OPL, &OPL->P_CH[2]);
		OPL_CALC_CH(OPL, &OPL->P_CH[3]);
		OPL_CALC_CH(OPL, &OPL->P_CH[4]);
		OPL_CALC_CH(OPL, &OPL->P_CH[5]);

		if(!rhythm)
		{
			OPL_CALC_CH(OPL, &OPL->P_CH[6]);
			OPL_CALC_CH(OPL, &OPL->P_CH[7]);
			OPL_CALC_CH(OPL, &OPL->P_CH[8]);
		}
		else        /* Rhythm part */
		{
			OPL_CALC_RH(OPL, &OPL->P_CH[0], (OPL->noise_rng>>0)&1 );
		}

		lt = OPL->output[0];

		/* store to sound buffer */
		bufL[i] = lt;
		bufR[i] = lt;

		advance(OPL);
	}

}